

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

long Pa_GetStreamWriteAvailable(PaStream *stream)

{
  PaError PVar1;
  PaStream *in_RDI;
  long result;
  PaError error;
  undefined8 local_18;
  
  PVar1 = PaUtil_ValidateStreamPointer(in_RDI);
  if (PVar1 == 0) {
    local_18 = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x58))(in_RDI);
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

signed long Pa_GetStreamWriteAvailable( PaStream* stream )
{
    PaError error = PaUtil_ValidateStreamPointer( stream );
    signed long result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetStreamWriteAvailable" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( error != paNoError )
    {
        result = 0;

        PA_LOGAPI(("Pa_GetStreamWriteAvailable returned:\n" ));
        PA_LOGAPI(("\tunsigned long: 0 [ PaError error: %d ( %s ) ]\n", error, Pa_GetErrorText( error ) ));

    }
    else
    {
        result = PA_STREAM_INTERFACE(stream)->GetWriteAvailable( stream );

        PA_LOGAPI(("Pa_GetStreamWriteAvailable returned:\n" ));
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    }

    return result;
}